

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeAdvancedBlend(FragmentProcessor *this,BlendEquationAdvanced equation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec4 *this_00;
  Vec4 *this_01;
  float *pfVar6;
  SampleData *pSVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Vector<float,_3> local_470;
  Vector<float,_3> local_464;
  undefined8 local_458;
  float local_450;
  float local_44c;
  Vec3 *pVStack_448;
  float p0_15;
  Vec3 *bias_15;
  Vec3 dstColor_15;
  Vec3 srcColor_15;
  SampleData *sample_15;
  int regSampleNdx_15;
  Vector<float,_3> local_40c;
  undefined8 local_400;
  float local_3f8;
  float local_3f4;
  Vec3 *pVStack_3f0;
  float p0_14;
  Vec3 *bias_14;
  Vec3 dstColor_14;
  Vec3 srcColor_14;
  SampleData *sample_14;
  int regSampleNdx_14;
  Vector<float,_3> local_3b4;
  undefined8 local_3a8;
  float local_3a0;
  float local_39c;
  Vec3 *pVStack_398;
  float p0_13;
  Vec3 *bias_13;
  Vec3 dstColor_13;
  Vec3 srcColor_13;
  SampleData *sample_13;
  int regSampleNdx_13;
  Vector<float,_3> local_35c;
  undefined8 local_350;
  float local_348;
  float local_344;
  Vec3 *pVStack_340;
  float p0_12;
  Vec3 *bias_12;
  Vec3 dstColor_12;
  Vec3 srcColor_12;
  SampleData *sample_12;
  int regSampleNdx_12;
  float local_30c;
  float local_308;
  float local_304;
  float b_10;
  float g_10;
  float r_10;
  float p0_11;
  Vec3 *bias_11;
  Vec4 *dstColor_11;
  Vec4 *srcColor_11;
  SampleData *sample_11;
  int regSampleNdx_11;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float b_9;
  float g_9;
  float r_9;
  float p0_10;
  Vec3 *bias_10;
  Vec4 *dstColor_10;
  Vec4 *srcColor_10;
  SampleData *sample_10;
  int regSampleNdx_10;
  float local_28c;
  float local_288;
  float local_284;
  float b_8;
  float g_8;
  float r_8;
  float p0_9;
  Vec3 *bias_9;
  Vec4 *dstColor_9;
  Vec4 *srcColor_9;
  SampleData *sample_9;
  int regSampleNdx_9;
  float local_24c;
  float local_248;
  float local_244;
  float b_7;
  float g_7;
  float r_7;
  float p0_8;
  Vec3 *bias_8;
  Vec4 *dstColor_8;
  Vec4 *srcColor_8;
  SampleData *sample_8;
  int regSampleNdx_8;
  float local_20c;
  float local_208;
  float local_204;
  float b_6;
  float g_6;
  float r_6;
  float p0_7;
  Vec3 *bias_7;
  Vec4 *dstColor_7;
  Vec4 *srcColor_7;
  SampleData *sample_7;
  int regSampleNdx_7;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float b_5;
  float g_5;
  float r_5;
  float p0_6;
  Vec3 *bias_6;
  Vec4 *dstColor_6;
  Vec4 *srcColor_6;
  SampleData *sample_6;
  int regSampleNdx_6;
  float local_18c;
  float local_188;
  float local_184;
  float b_4;
  float g_4;
  float r_4;
  float p0_5;
  Vec3 *bias_5;
  Vec4 *dstColor_5;
  Vec4 *srcColor_5;
  SampleData *sample_5;
  int regSampleNdx_5;
  float local_14c;
  float local_148;
  float local_144;
  float b_3;
  float g_3;
  float r_3;
  float p0_4;
  Vec3 *bias_4;
  Vec4 *dstColor_4;
  Vec4 *srcColor_4;
  SampleData *sample_4;
  int regSampleNdx_4;
  float local_10c;
  float local_108;
  float local_104;
  float b_2;
  float g_2;
  float r_2;
  float p0_3;
  Vec3 *bias_3;
  Vec4 *dstColor_3;
  Vec4 *srcColor_3;
  SampleData *sample_3;
  int regSampleNdx_3;
  float local_cc;
  float local_c8;
  float local_c4;
  float b_1;
  float g_1;
  float r_1;
  float p0_2;
  Vec3 *bias_2;
  Vec4 *dstColor_2;
  Vec4 *srcColor_2;
  SampleData *sample_2;
  int regSampleNdx_2;
  float local_8c;
  float local_88;
  float local_84;
  float b;
  float g;
  float r;
  float p0_1;
  Vec3 *bias_1;
  Vec4 *dstColor_1;
  Vec4 *srcColor_1;
  SampleData *sample_1;
  undefined1 auStack_50 [4];
  int regSampleNdx_1;
  Vec3 bias;
  float p2;
  float p1;
  float p0;
  float dstA;
  float srcA;
  Vec4 *dstColor;
  Vec4 *srcColor;
  SampleData *sample;
  int regSampleNdx;
  BlendEquationAdvanced equation_local;
  FragmentProcessor *this_local;
  
  for (sample._0_4_ = 0; (int)sample < 0x40; sample._0_4_ = (int)sample + 1) {
    if ((this->m_sampleRegister[(int)sample].isAlive & 1U) != 0) {
      this_00 = &this->m_sampleRegister[(int)sample].clampedBlendSrcColor;
      this_01 = &this->m_sampleRegister[(int)sample].clampedBlendDstColor;
      fVar8 = tcu::Vector<float,_4>::w(this_00);
      fVar9 = tcu::Vector<float,_4>::w(this_01);
      bias.m_data[2] = fVar8 * (1.0 - fVar9);
      bias.m_data[1] = fVar9 * (1.0 - fVar8);
      pfVar6 = tcu::Vector<float,_4>::operator[](this_00,0);
      fVar3 = bias.m_data[2];
      fVar1 = *pfVar6;
      pfVar6 = tcu::Vector<float,_4>::operator[](this_01,0);
      fVar11 = *pfVar6 * bias.m_data[1];
      pfVar6 = tcu::Vector<float,_4>::operator[](this_00,1);
      fVar4 = bias.m_data[2];
      fVar10 = *pfVar6;
      pfVar6 = tcu::Vector<float,_4>::operator[](this_01,1);
      fVar12 = *pfVar6 * bias.m_data[1];
      pfVar6 = tcu::Vector<float,_4>::operator[](this_00,2);
      fVar5 = bias.m_data[2];
      fVar2 = *pfVar6;
      pfVar6 = tcu::Vector<float,_4>::operator[](this_01,2);
      tcu::Vector<float,_3>::Vector
                ((Vector<float,_3> *)auStack_50,fVar1 * fVar3 + fVar11,fVar10 * fVar4 + fVar12,
                 fVar2 * fVar5 + *pfVar6 * bias.m_data[1]);
      *(undefined8 *)this->m_sampleRegister[(int)sample].blendSrcFactorRGB.m_data = _auStack_50;
      this->m_sampleRegister[(int)sample].blendSrcFactorRGB.m_data[2] = bias.m_data[0];
      this->m_sampleRegister[(int)sample].blendSrcFactorA = fVar8 * fVar9;
      this->m_sampleRegister[(int)sample].blendedA = fVar8 * fVar9 + bias.m_data[2] + bias.m_data[1]
      ;
    }
  }
  switch(equation) {
  case BLENDEQUATION_ADVANCED_MULTIPLY:
    for (sample_1._4_4_ = 0; sample_1._4_4_ < 0x40; sample_1._4_4_ = sample_1._4_4_ + 1) {
      if ((this->m_sampleRegister[sample_1._4_4_].isAlive & 1U) != 0) {
        srcColor_1 = (Vec4 *)(this->m_sampleRegister + sample_1._4_4_);
        dstColor_1 = &((SampleData *)srcColor_1)->clampedBlendSrcColor;
        bias_1 = (Vec3 *)&((SampleData *)srcColor_1)->clampedBlendDstColor;
        _r = &((SampleData *)srcColor_1)->blendSrcFactorRGB;
        g = ((SampleData *)srcColor_1)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_1,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_1,0);
        fVar10 = advblend::multiply(fVar1,*pfVar6);
        fVar1 = g;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r,0);
        b = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_1,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_1,1);
        fVar10 = advblend::multiply(fVar1,*pfVar6);
        fVar1 = g;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r,1);
        local_84 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_1,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_1,2);
        fVar10 = advblend::multiply(fVar1,*pfVar6);
        fVar1 = g;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r,2);
        local_88 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&sample_2 + 4),b,local_84,local_88)
        ;
        *(undefined8 *)(srcColor_1[5].m_data + 1) = stack0xffffffffffffff6c;
        srcColor_1[5].m_data[3] = local_8c;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_SCREEN:
    for (sample_2._0_4_ = 0; (int)sample_2 < 0x40; sample_2._0_4_ = (int)sample_2 + 1) {
      if ((this->m_sampleRegister[(int)sample_2].isAlive & 1U) != 0) {
        srcColor_2 = (Vec4 *)(this->m_sampleRegister + (int)sample_2);
        dstColor_2 = &((SampleData *)srcColor_2)->clampedBlendSrcColor;
        bias_2 = (Vec3 *)&((SampleData *)srcColor_2)->clampedBlendDstColor;
        _r_1 = &((SampleData *)srcColor_2)->blendSrcFactorRGB;
        g_1 = ((SampleData *)srcColor_2)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_2,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_2,0);
        fVar10 = advblend::screen(fVar1,*pfVar6);
        fVar1 = g_1;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_1,0);
        b_1 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_2,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_2,1);
        fVar10 = advblend::screen(fVar1,*pfVar6);
        fVar1 = g_1;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_1,1);
        local_c4 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_2,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_2,2);
        fVar10 = advblend::screen(fVar1,*pfVar6);
        fVar1 = g_1;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_1,2);
        local_c8 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_3 + 4),b_1,local_c4,local_c8);
        *(undefined8 *)(srcColor_2[5].m_data + 1) = stack0xffffffffffffff2c;
        srcColor_2[5].m_data[3] = local_cc;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_OVERLAY:
    for (sample_3._0_4_ = 0; (int)sample_3 < 0x40; sample_3._0_4_ = (int)sample_3 + 1) {
      if ((this->m_sampleRegister[(int)sample_3].isAlive & 1U) != 0) {
        srcColor_3 = (Vec4 *)(this->m_sampleRegister + (int)sample_3);
        dstColor_3 = &((SampleData *)srcColor_3)->clampedBlendSrcColor;
        bias_3 = (Vec3 *)&((SampleData *)srcColor_3)->clampedBlendDstColor;
        _r_2 = &((SampleData *)srcColor_3)->blendSrcFactorRGB;
        g_2 = ((SampleData *)srcColor_3)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_3,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_3,0);
        fVar10 = advblend::overlay(fVar1,*pfVar6);
        fVar1 = g_2;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_2,0);
        b_2 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_3,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_3,1);
        fVar10 = advblend::overlay(fVar1,*pfVar6);
        fVar1 = g_2;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_2,1);
        local_104 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_3,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_3,2);
        fVar10 = advblend::overlay(fVar1,*pfVar6);
        fVar1 = g_2;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_2,2);
        local_108 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_4 + 4),b_2,local_104,local_108);
        *(undefined8 *)(srcColor_3[5].m_data + 1) = stack0xfffffffffffffeec;
        srcColor_3[5].m_data[3] = local_10c;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_DARKEN:
    for (sample_4._0_4_ = 0; (int)sample_4 < 0x40; sample_4._0_4_ = (int)sample_4 + 1) {
      if ((this->m_sampleRegister[(int)sample_4].isAlive & 1U) != 0) {
        srcColor_4 = (Vec4 *)(this->m_sampleRegister + (int)sample_4);
        dstColor_4 = &((SampleData *)srcColor_4)->clampedBlendSrcColor;
        bias_4 = (Vec3 *)&((SampleData *)srcColor_4)->clampedBlendDstColor;
        _r_3 = &((SampleData *)srcColor_4)->blendSrcFactorRGB;
        g_3 = ((SampleData *)srcColor_4)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_4,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_4,0);
        fVar10 = advblend::darken(fVar1,*pfVar6);
        fVar1 = g_3;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_3,0);
        b_3 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_4,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_4,1);
        fVar10 = advblend::darken(fVar1,*pfVar6);
        fVar1 = g_3;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_3,1);
        local_144 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_4,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_4,2);
        fVar10 = advblend::darken(fVar1,*pfVar6);
        fVar1 = g_3;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_3,2);
        local_148 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_5 + 4),b_3,local_144,local_148);
        *(undefined8 *)(srcColor_4[5].m_data + 1) = stack0xfffffffffffffeac;
        srcColor_4[5].m_data[3] = local_14c;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_LIGHTEN:
    for (sample_5._0_4_ = 0; (int)sample_5 < 0x40; sample_5._0_4_ = (int)sample_5 + 1) {
      if ((this->m_sampleRegister[(int)sample_5].isAlive & 1U) != 0) {
        srcColor_5 = (Vec4 *)(this->m_sampleRegister + (int)sample_5);
        dstColor_5 = &((SampleData *)srcColor_5)->clampedBlendSrcColor;
        bias_5 = (Vec3 *)&((SampleData *)srcColor_5)->clampedBlendDstColor;
        _r_4 = &((SampleData *)srcColor_5)->blendSrcFactorRGB;
        g_4 = ((SampleData *)srcColor_5)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_5,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_5,0);
        fVar10 = advblend::lighten(fVar1,*pfVar6);
        fVar1 = g_4;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_4,0);
        b_4 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_5,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_5,1);
        fVar10 = advblend::lighten(fVar1,*pfVar6);
        fVar1 = g_4;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_4,1);
        local_184 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_5,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_5,2);
        fVar10 = advblend::lighten(fVar1,*pfVar6);
        fVar1 = g_4;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_4,2);
        local_188 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_6 + 4),b_4,local_184,local_188);
        *(undefined8 *)(srcColor_5[5].m_data + 1) = stack0xfffffffffffffe6c;
        srcColor_5[5].m_data[3] = local_18c;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_COLORDODGE:
    for (sample_6._0_4_ = 0; (int)sample_6 < 0x40; sample_6._0_4_ = (int)sample_6 + 1) {
      if ((this->m_sampleRegister[(int)sample_6].isAlive & 1U) != 0) {
        srcColor_6 = (Vec4 *)(this->m_sampleRegister + (int)sample_6);
        dstColor_6 = &((SampleData *)srcColor_6)->clampedBlendSrcColor;
        bias_6 = (Vec3 *)&((SampleData *)srcColor_6)->clampedBlendDstColor;
        _r_5 = &((SampleData *)srcColor_6)->blendSrcFactorRGB;
        g_5 = ((SampleData *)srcColor_6)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_6,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_6,0);
        fVar10 = advblend::colordodge(fVar1,*pfVar6);
        fVar1 = g_5;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_5,0);
        b_5 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_6,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_6,1);
        fVar10 = advblend::colordodge(fVar1,*pfVar6);
        fVar1 = g_5;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_5,1);
        local_1c4 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_6,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_6,2);
        fVar10 = advblend::colordodge(fVar1,*pfVar6);
        fVar1 = g_5;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_5,2);
        local_1c8 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_7 + 4),b_5,local_1c4,local_1c8);
        *(undefined8 *)(srcColor_6[5].m_data + 1) = stack0xfffffffffffffe2c;
        srcColor_6[5].m_data[3] = local_1cc;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_COLORBURN:
    for (sample_7._0_4_ = 0; (int)sample_7 < 0x40; sample_7._0_4_ = (int)sample_7 + 1) {
      if ((this->m_sampleRegister[(int)sample_7].isAlive & 1U) != 0) {
        srcColor_7 = (Vec4 *)(this->m_sampleRegister + (int)sample_7);
        dstColor_7 = &((SampleData *)srcColor_7)->clampedBlendSrcColor;
        bias_7 = (Vec3 *)&((SampleData *)srcColor_7)->clampedBlendDstColor;
        _r_6 = &((SampleData *)srcColor_7)->blendSrcFactorRGB;
        g_6 = ((SampleData *)srcColor_7)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_7,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_7,0);
        fVar10 = advblend::colorburn(fVar1,*pfVar6);
        fVar1 = g_6;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_6,0);
        b_6 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_7,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_7,1);
        fVar10 = advblend::colorburn(fVar1,*pfVar6);
        fVar1 = g_6;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_6,1);
        local_204 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_7,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_7,2);
        fVar10 = advblend::colorburn(fVar1,*pfVar6);
        fVar1 = g_6;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_6,2);
        local_208 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_8 + 4),b_6,local_204,local_208);
        *(undefined8 *)(srcColor_7[5].m_data + 1) = stack0xfffffffffffffdec;
        srcColor_7[5].m_data[3] = local_20c;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_HARDLIGHT:
    for (sample_8._0_4_ = 0; (int)sample_8 < 0x40; sample_8._0_4_ = (int)sample_8 + 1) {
      if ((this->m_sampleRegister[(int)sample_8].isAlive & 1U) != 0) {
        srcColor_8 = (Vec4 *)(this->m_sampleRegister + (int)sample_8);
        dstColor_8 = &((SampleData *)srcColor_8)->clampedBlendSrcColor;
        bias_8 = (Vec3 *)&((SampleData *)srcColor_8)->clampedBlendDstColor;
        _r_7 = &((SampleData *)srcColor_8)->blendSrcFactorRGB;
        g_7 = ((SampleData *)srcColor_8)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_8,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_8,0);
        fVar10 = advblend::hardlight(fVar1,*pfVar6);
        fVar1 = g_7;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_7,0);
        b_7 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_8,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_8,1);
        fVar10 = advblend::hardlight(fVar1,*pfVar6);
        fVar1 = g_7;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_7,1);
        local_244 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_8,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_8,2);
        fVar10 = advblend::hardlight(fVar1,*pfVar6);
        fVar1 = g_7;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_7,2);
        local_248 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_9 + 4),b_7,local_244,local_248);
        *(undefined8 *)(srcColor_8[5].m_data + 1) = stack0xfffffffffffffdac;
        srcColor_8[5].m_data[3] = local_24c;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_SOFTLIGHT:
    for (sample_9._0_4_ = 0; (int)sample_9 < 0x40; sample_9._0_4_ = (int)sample_9 + 1) {
      if ((this->m_sampleRegister[(int)sample_9].isAlive & 1U) != 0) {
        srcColor_9 = (Vec4 *)(this->m_sampleRegister + (int)sample_9);
        dstColor_9 = &((SampleData *)srcColor_9)->clampedBlendSrcColor;
        bias_9 = (Vec3 *)&((SampleData *)srcColor_9)->clampedBlendDstColor;
        _r_8 = &((SampleData *)srcColor_9)->blendSrcFactorRGB;
        g_8 = ((SampleData *)srcColor_9)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_9,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_9,0);
        fVar10 = advblend::softlight(fVar1,*pfVar6);
        fVar1 = g_8;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_8,0);
        b_8 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_9,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_9,1);
        fVar10 = advblend::softlight(fVar1,*pfVar6);
        fVar1 = g_8;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_8,1);
        local_284 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_9,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_9,2);
        fVar10 = advblend::softlight(fVar1,*pfVar6);
        fVar1 = g_8;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_8,2);
        local_288 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_10 + 4),b_8,local_284,local_288);
        *(undefined8 *)(srcColor_9[5].m_data + 1) = stack0xfffffffffffffd6c;
        srcColor_9[5].m_data[3] = local_28c;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_DIFFERENCE:
    for (sample_10._0_4_ = 0; (int)sample_10 < 0x40; sample_10._0_4_ = (int)sample_10 + 1) {
      if ((this->m_sampleRegister[(int)sample_10].isAlive & 1U) != 0) {
        srcColor_10 = (Vec4 *)(this->m_sampleRegister + (int)sample_10);
        dstColor_10 = &((SampleData *)srcColor_10)->clampedBlendSrcColor;
        bias_10 = (Vec3 *)&((SampleData *)srcColor_10)->clampedBlendDstColor;
        _r_9 = &((SampleData *)srcColor_10)->blendSrcFactorRGB;
        g_9 = ((SampleData *)srcColor_10)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_10,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_10,0);
        fVar10 = advblend::difference(fVar1,*pfVar6);
        fVar1 = g_9;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_9,0);
        b_9 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_10,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_10,1);
        fVar10 = advblend::difference(fVar1,*pfVar6);
        fVar1 = g_9;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_9,1);
        local_2c4 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_10,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_10,2);
        fVar10 = advblend::difference(fVar1,*pfVar6);
        fVar1 = g_9;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_9,2);
        local_2c8 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_11 + 4),b_9,local_2c4,local_2c8);
        *(undefined8 *)(srcColor_10[5].m_data + 1) = stack0xfffffffffffffd2c;
        srcColor_10[5].m_data[3] = local_2cc;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_EXCLUSION:
    for (sample_11._0_4_ = 0; (int)sample_11 < 0x40; sample_11._0_4_ = (int)sample_11 + 1) {
      if ((this->m_sampleRegister[(int)sample_11].isAlive & 1U) != 0) {
        srcColor_11 = (Vec4 *)(this->m_sampleRegister + (int)sample_11);
        dstColor_11 = &((SampleData *)srcColor_11)->clampedBlendSrcColor;
        bias_11 = (Vec3 *)&((SampleData *)srcColor_11)->clampedBlendDstColor;
        _r_10 = &((SampleData *)srcColor_11)->blendSrcFactorRGB;
        g_10 = ((SampleData *)srcColor_11)->blendSrcFactorA;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_11,0);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_11,0);
        fVar10 = advblend::exclusion(fVar1,*pfVar6);
        fVar1 = g_10;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_10,0);
        b_10 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_11,1);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_11,1);
        fVar10 = advblend::exclusion(fVar1,*pfVar6);
        fVar1 = g_10;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_10,1);
        local_304 = fVar10 * fVar1 + *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[](dstColor_11,2);
        fVar1 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)bias_11,2);
        fVar10 = advblend::exclusion(fVar1,*pfVar6);
        fVar1 = g_10;
        pfVar6 = tcu::Vector<float,_3>::operator[](_r_10,2);
        local_308 = fVar10 * fVar1 + *pfVar6;
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)((long)&sample_12 + 4),b_10,local_304,local_308);
        *(undefined8 *)(srcColor_11[5].m_data + 1) = stack0xfffffffffffffcec;
        srcColor_11[5].m_data[3] = local_30c;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_HSL_HUE:
    for (sample_12._0_4_ = 0; (int)sample_12 < 0x40; sample_12._0_4_ = (int)sample_12 + 1) {
      if ((this->m_sampleRegister[(int)sample_12].isAlive & 1U) != 0) {
        pSVar7 = this->m_sampleRegister + (int)sample_12;
        tcu::Vector<float,_4>::swizzle
                  ((Vector<float,_4> *)(dstColor_12.m_data + 1),(int)pSVar7 + 4,0,1);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&bias_12,(int)pSVar7 + 0x24,0,1);
        pVStack_340 = &pSVar7->blendSrcFactorRGB;
        local_344 = pSVar7->blendSrcFactorA;
        advblend::setLumSat((advblend *)&stack0xfffffffffffffc98,(Vec3 *)(dstColor_12.m_data + 1),
                            (Vec3 *)&bias_12,(Vec3 *)&bias_12);
        tcu::operator*((tcu *)&local_35c,(Vector<float,_3> *)&stack0xfffffffffffffc98,local_344);
        tcu::operator+((tcu *)&local_350,&local_35c,pVStack_340);
        *(undefined8 *)(pSVar7->blendedRGB).m_data = local_350;
        (pSVar7->blendedRGB).m_data[2] = local_348;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_HSL_SATURATION:
    for (sample_13._4_4_ = 0; sample_13._4_4_ < 0x40; sample_13._4_4_ = sample_13._4_4_ + 1) {
      if ((this->m_sampleRegister[sample_13._4_4_].isAlive & 1U) != 0) {
        pSVar7 = this->m_sampleRegister + sample_13._4_4_;
        tcu::Vector<float,_4>::swizzle
                  ((Vector<float,_4> *)(dstColor_13.m_data + 1),(int)pSVar7 + 4,0,1);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&bias_13,(int)pSVar7 + 0x24,0,1);
        pVStack_398 = &pSVar7->blendSrcFactorRGB;
        local_39c = pSVar7->blendSrcFactorA;
        advblend::setLumSat((advblend *)&stack0xfffffffffffffc40,(Vec3 *)&bias_13,
                            (Vec3 *)(dstColor_13.m_data + 1),(Vec3 *)&bias_13);
        tcu::operator*((tcu *)&local_3b4,(Vector<float,_3> *)&stack0xfffffffffffffc40,local_39c);
        tcu::operator+((tcu *)&local_3a8,&local_3b4,pVStack_398);
        *(undefined8 *)(pSVar7->blendedRGB).m_data = local_3a8;
        (pSVar7->blendedRGB).m_data[2] = local_3a0;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_HSL_COLOR:
    for (sample_14._4_4_ = 0; sample_14._4_4_ < 0x40; sample_14._4_4_ = sample_14._4_4_ + 1) {
      if ((this->m_sampleRegister[sample_14._4_4_].isAlive & 1U) != 0) {
        pSVar7 = this->m_sampleRegister + sample_14._4_4_;
        tcu::Vector<float,_4>::swizzle
                  ((Vector<float,_4> *)(dstColor_14.m_data + 1),(int)pSVar7 + 4,0,1);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&bias_14,(int)pSVar7 + 0x24,0,1);
        pVStack_3f0 = &pSVar7->blendSrcFactorRGB;
        local_3f4 = pSVar7->blendSrcFactorA;
        advblend::setLum((advblend *)&stack0xfffffffffffffbe8,(Vec3 *)(dstColor_14.m_data + 1),
                         (Vec3 *)&bias_14);
        tcu::operator*((tcu *)&local_40c,(Vector<float,_3> *)&stack0xfffffffffffffbe8,local_3f4);
        tcu::operator+((tcu *)&local_400,&local_40c,pVStack_3f0);
        *(undefined8 *)(pSVar7->blendedRGB).m_data = local_400;
        (pSVar7->blendedRGB).m_data[2] = local_3f8;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_HSL_LUMINOSITY:
    for (sample_15._4_4_ = 0; sample_15._4_4_ < 0x40; sample_15._4_4_ = sample_15._4_4_ + 1) {
      if ((this->m_sampleRegister[sample_15._4_4_].isAlive & 1U) != 0) {
        pSVar7 = this->m_sampleRegister + sample_15._4_4_;
        tcu::Vector<float,_4>::swizzle
                  ((Vector<float,_4> *)(dstColor_15.m_data + 1),(int)pSVar7 + 4,0,1);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&bias_15,(int)pSVar7 + 0x24,0,1);
        pVStack_448 = &pSVar7->blendSrcFactorRGB;
        local_44c = pSVar7->blendSrcFactorA;
        advblend::setLum((advblend *)&local_470,(Vec3 *)&bias_15,(Vec3 *)(dstColor_15.m_data + 1));
        tcu::operator*((tcu *)&local_464,&local_470,local_44c);
        tcu::operator+((tcu *)&local_458,&local_464,pVStack_448);
        *(undefined8 *)(pSVar7->blendedRGB).m_data = local_458;
        (pSVar7->blendedRGB).m_data[2] = local_450;
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeAdvancedBlend (BlendEquationAdvanced equation)
{
	using namespace advblend;

#define SAMPLE_REGISTER_ADV_BLEND(FUNCTION_NAME)											\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)			\
	{																						\
		if (m_sampleRegister[regSampleNdx].isAlive)											\
		{																					\
			SampleData&	sample		= m_sampleRegister[regSampleNdx];						\
			const Vec4&	srcColor	= sample.clampedBlendSrcColor;							\
			const Vec4&	dstColor	= sample.clampedBlendDstColor;							\
			const Vec3&	bias		= sample.blendSrcFactorRGB;								\
			const float	p0			= sample.blendSrcFactorA;								\
			const float	r			= FUNCTION_NAME(srcColor[0], dstColor[0])*p0 + bias[0];	\
			const float	g			= FUNCTION_NAME(srcColor[1], dstColor[1])*p0 + bias[1];	\
			const float	b			= FUNCTION_NAME(srcColor[2], dstColor[2])*p0 + bias[2];	\
																							\
			sample.blendedRGB = Vec3(r, g, b);												\
		}																					\
	}

#define SAMPLE_REGISTER_ADV_BLEND_HSL(COLOR_EXPRESSION)										\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)			\
	{																						\
		if (m_sampleRegister[regSampleNdx].isAlive)											\
		{																					\
			SampleData&	sample		= m_sampleRegister[regSampleNdx];						\
			const Vec3	srcColor	= sample.clampedBlendSrcColor.swizzle(0,1,2);			\
			const Vec3	dstColor	= sample.clampedBlendDstColor.swizzle(0,1,2);			\
			const Vec3&	bias		= sample.blendSrcFactorRGB;								\
			const float	p0			= sample.blendSrcFactorA;								\
																							\
			sample.blendedRGB = (COLOR_EXPRESSION)*p0 + bias;								\
		}																					\
	}

	// Pre-compute factors & compute alpha \todo [2014-03-18 pyry] Re-using variable names.
	// \note clampedBlend*Color contains clamped & unpremultiplied colors
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			SampleData&	sample		= m_sampleRegister[regSampleNdx];
			const Vec4&	srcColor	= sample.clampedBlendSrcColor;
			const Vec4&	dstColor	= sample.clampedBlendDstColor;
			const float	srcA		= srcColor.w();
			const float	dstA		= dstColor.w();
			const float	p0			= srcA*dstA;
			const float p1			= srcA*(1.0f-dstA);
			const float p2			= dstA*(1.0f-srcA);
			const Vec3	bias		(srcColor[0]*p1 + dstColor[0]*p2,
									 srcColor[1]*p1 + dstColor[1]*p2,
									 srcColor[2]*p1 + dstColor[2]*p2);

			sample.blendSrcFactorRGB	= bias;
			sample.blendSrcFactorA		= p0;
			sample.blendedA				= p0 + p1 + p2;
		}
	}

	switch (equation)
	{
		case BLENDEQUATION_ADVANCED_MULTIPLY:		SAMPLE_REGISTER_ADV_BLEND(multiply);									break;
		case BLENDEQUATION_ADVANCED_SCREEN:			SAMPLE_REGISTER_ADV_BLEND(screen);										break;
		case BLENDEQUATION_ADVANCED_OVERLAY:		SAMPLE_REGISTER_ADV_BLEND(overlay);										break;
		case BLENDEQUATION_ADVANCED_DARKEN:			SAMPLE_REGISTER_ADV_BLEND(darken);										break;
		case BLENDEQUATION_ADVANCED_LIGHTEN:		SAMPLE_REGISTER_ADV_BLEND(lighten);										break;
		case BLENDEQUATION_ADVANCED_COLORDODGE:		SAMPLE_REGISTER_ADV_BLEND(colordodge);									break;
		case BLENDEQUATION_ADVANCED_COLORBURN:		SAMPLE_REGISTER_ADV_BLEND(colorburn);									break;
		case BLENDEQUATION_ADVANCED_HARDLIGHT:		SAMPLE_REGISTER_ADV_BLEND(hardlight);									break;
		case BLENDEQUATION_ADVANCED_SOFTLIGHT:		SAMPLE_REGISTER_ADV_BLEND(softlight);									break;
		case BLENDEQUATION_ADVANCED_DIFFERENCE:		SAMPLE_REGISTER_ADV_BLEND(difference);									break;
		case BLENDEQUATION_ADVANCED_EXCLUSION:		SAMPLE_REGISTER_ADV_BLEND(exclusion);									break;
		case BLENDEQUATION_ADVANCED_HSL_HUE:		SAMPLE_REGISTER_ADV_BLEND_HSL(setLumSat(srcColor, dstColor, dstColor));	break;
		case BLENDEQUATION_ADVANCED_HSL_SATURATION:	SAMPLE_REGISTER_ADV_BLEND_HSL(setLumSat(dstColor, srcColor, dstColor));	break;
		case BLENDEQUATION_ADVANCED_HSL_COLOR:		SAMPLE_REGISTER_ADV_BLEND_HSL(setLum(srcColor, dstColor));				break;
		case BLENDEQUATION_ADVANCED_HSL_LUMINOSITY:	SAMPLE_REGISTER_ADV_BLEND_HSL(setLum(dstColor, srcColor));				break;
		default:
			DE_ASSERT(false);
	}

#undef SAMPLE_REGISTER_ADV_BLEND
#undef SAMPLE_REGISTER_ADV_BLEND_HSL
}